

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void anon_unknown.dwarf_c7dac::StateTestBPMINT(BinaryPolynomialModel<int,_double> *bpm)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  double *pdVar2;
  bool bVar3;
  const_iterator __begin1;
  double *pdVar4;
  const_iterator cVar5;
  vector<int,_std::allocator<int>_> *it;
  pointer pvVar6;
  int iVar7;
  pointer *__ptr_1;
  AssertHelperData *pAVar8;
  long lVar9;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var10;
  char *pcVar11;
  char *in_R9;
  pointer *__ptr;
  __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  _Var12;
  double dVar13;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<int> __l_09;
  initializer_list<int> __l_10;
  initializer_list<int> __l_11;
  initializer_list<int> __l_12;
  initializer_list<int> __l_13;
  initializer_list<int> __l_14;
  initializer_list<int> __l_15;
  initializer_list<int> __l_16;
  initializer_list<int> __l_17;
  initializer_list<int> __l_18;
  initializer_list<int> __l_19;
  initializer_list<int> __l_20;
  initializer_list<int> __l_21;
  initializer_list<int> __l_22;
  initializer_list<int> __l_23;
  initializer_list<int> __l_24;
  initializer_list<int> __l_25;
  initializer_list<int> __l_26;
  initializer_list<int> __l_27;
  initializer_list<int> __l_28;
  initializer_list<int> __l_29;
  initializer_list<int> __l_30;
  initializer_list<int> __l_31;
  initializer_list<int> __l_32;
  initializer_list<int> __l_33;
  initializer_list<int> __l_34;
  initializer_list<int> __l_35;
  initializer_list<int> __l_36;
  vector<int,_std::allocator<int>_> sorted_variables;
  AssertHelper local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_90;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_80;
  pointer local_78;
  AssertHelper local_70;
  undefined1 local_68 [8];
  undefined4 uStack_60;
  undefined4 uStack_5c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_58;
  allocator_type local_39;
  undefined4 local_38 [2];
  
  local_88 = (undefined1  [8])(bpm->variables_)._M_h._M_element_count;
  local_98.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_68,"bpm.GetNumVariables()","4",(unsigned_long *)local_88,
             (int *)&local_98);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((undefined8 *)CONCAT44(uStack_5c,uStack_60) == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)CONCAT44(uStack_5c,uStack_60);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x152,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_88 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_5c,uStack_60) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_5c,uStack_60));
  }
  dVar13 = cimod::BinaryPolynomialModel<int,_double>::GetOffset(bpm);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_68,"bpm.GetOffset()","0.0",dVar13,0.0);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((undefined8 *)CONCAT44(uStack_5c,uStack_60) == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)CONCAT44(uStack_5c,uStack_60);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x154,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_88 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_5c,uStack_60) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_5c,uStack_60));
  }
  local_88 = (undefined1  [8])
             (((long)(bpm->poly_key_list_).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(bpm->poly_key_list_).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_98.data_._0_4_ = 0xf;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_68,"bpm.GetNumInteractions()","15",(unsigned_long *)local_88,
             (int *)&local_98);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((undefined8 *)CONCAT44(uStack_5c,uStack_60) == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)CONCAT44(uStack_5c,uStack_60);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x156,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_88 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_5c,uStack_60) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_5c,uStack_60));
  }
  local_88 = (undefined1  [8])0x0;
  for (pvVar6 = (bpm->poly_key_list_).
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar6 != (bpm->poly_key_list_).
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pvVar6 = pvVar6 + 1) {
    _Var10._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )((long)(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 2);
    if ((ulong)local_88 <=
        (ulong)_Var10._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl) {
      local_88 = (undefined1  [8])
                 _Var10._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
    }
  }
  local_98.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_68,"bpm.GetDegree()","4",(unsigned_long *)local_88,(int *)&local_98);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((undefined8 *)CONCAT44(uStack_5c,uStack_60) == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)CONCAT44(uStack_5c,uStack_60);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x158,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_88 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_5c,uStack_60) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_5c,uStack_60));
  }
  local_98.data_._0_4_ = 0xffffffff;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l,(allocator_type *)&local_70);
  dVar13 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
                     (bpm,(vector<int,_std::allocator<int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({-1} )","1.0",dVar13,1.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x15b,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_._0_4_ = 0xfffffffe;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_00,(allocator_type *)&local_70);
  dVar13 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
                     (bpm,(vector<int,_std::allocator<int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({-2} )","2.0",dVar13,2.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x15c,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_._0_4_ = 0xfffffffd;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_01,(allocator_type *)&local_70);
  dVar13 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
                     (bpm,(vector<int,_std::allocator<int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({-3} )","3.0",dVar13,3.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x15d,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_._0_4_ = 0xfffffffc;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_02,(allocator_type *)&local_70);
  dVar13 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
                     (bpm,(vector<int,_std::allocator<int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({-4} )","4.0",dVar13,4.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x15e,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_ = (AssertHelperData *)0xfffffffffffffffe;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_03,(allocator_type *)&local_70);
  dVar13 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
                     (bpm,(vector<int,_std::allocator<int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({-2, -1} )","12.0",dVar13,12.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x15f,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_ = (AssertHelperData *)0xfffffffffffffffd;
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_04,(allocator_type *)&local_70);
  dVar13 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
                     (bpm,(vector<int,_std::allocator<int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({-3, -1} )","13.0",dVar13,13.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x160,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_ = (AssertHelperData *)0xfffffffffffffffc;
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_05,(allocator_type *)&local_70);
  dVar13 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
                     (bpm,(vector<int,_std::allocator<int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({-4, -1} )","14.0",dVar13,14.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x161,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_ = (AssertHelperData *)0xfffffffefffffffd;
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_06,(allocator_type *)&local_70);
  dVar13 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
                     (bpm,(vector<int,_std::allocator<int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({-3, -2} )","23.0",dVar13,23.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x162,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_ = (AssertHelperData *)0xfffffffefffffffc;
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_07,(allocator_type *)&local_70);
  dVar13 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
                     (bpm,(vector<int,_std::allocator<int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({-4, -2} )","24.0",dVar13,24.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x163,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_ = (AssertHelperData *)0xfffffffdfffffffc;
  __l_08._M_len = 2;
  __l_08._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_08,(allocator_type *)&local_70);
  dVar13 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
                     (bpm,(vector<int,_std::allocator<int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({-4, -3} )","34.0",dVar13,34.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x164,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_ = (AssertHelperData *)0xfffffffefffffffd;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(pbStack_90._4_4_,0xffffffff);
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_09,(allocator_type *)&local_70);
  dVar13 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
                     (bpm,(vector<int,_std::allocator<int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({-3, -2, -1} )","123.0",dVar13,123.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x165,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_ = (AssertHelperData *)0xfffffffefffffffc;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(pbStack_90._4_4_,0xffffffff);
  __l_10._M_len = 3;
  __l_10._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_10,(allocator_type *)&local_70);
  dVar13 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
                     (bpm,(vector<int,_std::allocator<int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({-4, -2, -1} )","124.0",dVar13,124.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x166,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_ = (AssertHelperData *)0xfffffffdfffffffc;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(pbStack_90._4_4_,0xffffffff);
  __l_11._M_len = 3;
  __l_11._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_11,(allocator_type *)&local_70);
  dVar13 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
                     (bpm,(vector<int,_std::allocator<int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({-4, -3, -1} )","134.0",dVar13,134.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x167,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_ = (AssertHelperData *)0xfffffffdfffffffc;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(pbStack_90._4_4_,0xfffffffe);
  __l_12._M_len = 3;
  __l_12._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_12,(allocator_type *)&local_70);
  dVar13 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
                     (bpm,(vector<int,_std::allocator<int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({-4, -3, -2} )","234.0",dVar13,234.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x168,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_ = (AssertHelperData *)0xfffffffdfffffffc;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0xfffffffffffffffe;
  __l_13._M_len = 4;
  __l_13._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_13,(allocator_type *)&local_70);
  dVar13 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
                     (bpm,(vector<int,_std::allocator<int>_> *)local_68);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"bpm.GetPolynomial({-4, -3, -2, -1})","1234.0",dVar13,1234.0);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x169,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_68 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  if (bpm->vartype_ == BINARY) {
    local_98.data_ = (AssertHelperData *)0xffffffffffffffff;
    pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 0xffffffffffffffff;
    __l_15._M_len = 4;
    __l_15._M_array = (iterator)&local_98;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_68,__l_15,(allocator_type *)&local_70);
    dVar13 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
                       (bpm,(vector<int,_std::allocator<int>_> *)local_68);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_88,"bpm.GetPolynomial({-1, -1, -1, -1} )","1.0",dVar13,1.0);
    if (local_68 != (undefined1  [8])0x0) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
    }
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = "";
      }
      else {
        pcVar11 = (pbStack_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x173,pcVar11);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )local_68 !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(size_type *)local_68 + 8))();
      }
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
    local_88 = (undefined1  [8])0xffffffffffffffff;
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 0xfffffffeffffffff;
    local_78 = (pointer)CONCAT44(local_78._4_4_,0xfffffffe);
    __l_17._M_len = 5;
    __l_17._M_array = (iterator)local_88;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_68,__l_17,(allocator_type *)&local_70);
    dVar13 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
                       (bpm,(vector<int,_std::allocator<int>_> *)local_68);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&local_98,"bpm.GetPolynomial({-1, -1, -1, -2, -2} )","12.0",dVar13,12.0);
    if (local_68 != (undefined1  [8])0x0) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
    }
    if (local_98.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = "";
      }
      else {
        pcVar11 = (pbStack_90->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x174,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )local_68 !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(size_type *)local_68 + 8))();
      }
    }
    if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_90,pbStack_90);
    }
    local_88 = (undefined1  [8])0xfffffffdffffffff;
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 0xfffffffdfffffffd;
    local_78 = (pointer)CONCAT44(local_78._4_4_,0xffffffff);
    __l_19._M_len = 5;
    __l_19._M_array = (iterator)local_88;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_68,__l_19,(allocator_type *)&local_70);
    dVar13 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
                       (bpm,(vector<int,_std::allocator<int>_> *)local_68);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&local_98,"bpm.GetPolynomial({-1, -3, -3, -3, -1} )","13.0",dVar13,13.0);
    if (local_68 != (undefined1  [8])0x0) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
    }
    if (local_98.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = "";
      }
      else {
        pcVar11 = (pbStack_90->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x175,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
      if ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )local_68 !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(size_type *)local_68 + 8))();
      }
    }
    if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_90,pbStack_90);
    }
    aStack_58._M_allocated_capacity._0_4_ = -3;
    aStack_58._M_allocated_capacity._4_4_ = 0xfffffffe;
    aStack_58._8_4_ = 0xfffffffe;
    local_68 = (undefined1  [8])0xfffffffefffffffd;
    uStack_60 = 0xfffffffd;
    uStack_5c = 0xfffffffe;
    __l_21._M_len = 7;
    __l_21._M_array = (iterator)local_68;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_88,__l_21,(allocator_type *)&local_70);
    dVar13 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
                       (bpm,(vector<int,_std::allocator<int>_> *)local_88);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&local_98,"bpm.GetPolynomial({-3, -2, -3, -2, -3, -2, -2})","23.0",dVar13
               ,23.0);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_88 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      operator_delete((void *)local_88,(long)local_78 - (long)local_88);
    }
    if (local_98.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = "";
      }
      else {
        pcVar11 = (pbStack_90->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x176,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_68);
LAB_0011ff87:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
      if (local_68 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_68 + 8))();
      }
    }
LAB_0011ffa1:
    if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_90,pbStack_90);
    }
  }
  else if (bpm->vartype_ == SPIN) {
    local_98.data_ = (AssertHelperData *)0xffffffffffffffff;
    pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(pbStack_90._4_4_,0xffffffff);
    __l_14._M_len = 3;
    __l_14._M_array = (iterator)&local_98;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_68,__l_14,(allocator_type *)&local_70);
    dVar13 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
                       (bpm,(vector<int,_std::allocator<int>_> *)local_68);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_88,"bpm.GetPolynomial({-1, -1, -1} )","1.0",dVar13,1.0);
    if (local_68 != (undefined1  [8])0x0) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
    }
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = "";
      }
      else {
        pcVar11 = (pbStack_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x16d,pcVar11);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )local_68 !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(size_type *)local_68 + 8))();
      }
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
    local_98.data_ = (AssertHelperData *)0xffffffffffffffff;
    pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 0xfffffffeffffffff;
    __l_16._M_len = 4;
    __l_16._M_array = (iterator)&local_98;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_68,__l_16,(allocator_type *)&local_70);
    dVar13 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
                       (bpm,(vector<int,_std::allocator<int>_> *)local_68);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_88,"bpm.GetPolynomial({-1, -1, -1, -2} )","12.0",dVar13,12.0);
    if (local_68 != (undefined1  [8])0x0) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
    }
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = "";
      }
      else {
        pcVar11 = (pbStack_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x16e,pcVar11);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )local_68 !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(size_type *)local_68 + 8))();
      }
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
    local_98.data_ = (AssertHelperData *)0xfffffffdffffffff;
    pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 0xfffffffdfffffffd;
    __l_18._M_len = 4;
    __l_18._M_array = (iterator)&local_98;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_68,__l_18,(allocator_type *)&local_70);
    dVar13 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
                       (bpm,(vector<int,_std::allocator<int>_> *)local_68);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_88,"bpm.GetPolynomial({-1, -3, -3, -3} )","13.0",dVar13,13.0);
    if (local_68 != (undefined1  [8])0x0) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
    }
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = "";
      }
      else {
        pcVar11 = (pbStack_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x16f,pcVar11);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )local_68 !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(size_type *)local_68 + 8))();
      }
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
    local_88 = (undefined1  [8])0xfffffffefffffffd;
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 0xfffffffefffffffd;
    local_78 = (pointer)0xfffffffefffffffd;
    __l_20._M_len = 6;
    __l_20._M_array = (iterator)local_88;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_68,__l_20,(allocator_type *)&local_70);
    dVar13 = cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
                       (bpm,(vector<int,_std::allocator<int>_> *)local_68);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&local_98,"bpm.GetPolynomial({-3, -2, -3, -2, -3, -2})","23.0",dVar13,
               23.0);
    if (local_68 != (undefined1  [8])0x0) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
    }
    if (local_98.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_68);
      if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar11 = "";
      }
      else {
        pcVar11 = (pbStack_90->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
                 0x170,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_68);
      goto LAB_0011ff87;
    }
    goto LAB_0011ffa1;
  }
  local_98.data_._0_4_ = 0xfffffffc;
  local_88 = (undefined1  [8])
             cimod::BinaryPolynomialModel<int,_double>::GetVariablesToIntegers(bpm,(int *)&local_98)
  ;
  local_70.data_ = (AssertHelperData *)((ulong)local_70.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_68,"bpm.GetVariablesToIntegers(-4)","0",(long *)local_88,
             (int *)&local_70);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((undefined8 *)CONCAT44(uStack_5c,uStack_60) == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)CONCAT44(uStack_5c,uStack_60);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x17a,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_88 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_5c,uStack_60) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_5c,uStack_60));
  }
  local_98.data_._0_4_ = 0xfffffffd;
  local_88 = (undefined1  [8])
             cimod::BinaryPolynomialModel<int,_double>::GetVariablesToIntegers(bpm,(int *)&local_98)
  ;
  local_70.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_68,"bpm.GetVariablesToIntegers(-3)","1",(long *)local_88,
             (int *)&local_70);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((undefined8 *)CONCAT44(uStack_5c,uStack_60) == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)CONCAT44(uStack_5c,uStack_60);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x17b,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_88 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_5c,uStack_60) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_5c,uStack_60));
  }
  local_98.data_._0_4_ = 0xfffffffe;
  local_88 = (undefined1  [8])
             cimod::BinaryPolynomialModel<int,_double>::GetVariablesToIntegers(bpm,(int *)&local_98)
  ;
  local_70.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_68,"bpm.GetVariablesToIntegers(-2)","2",(long *)local_88,
             (int *)&local_70);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((undefined8 *)CONCAT44(uStack_5c,uStack_60) == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)CONCAT44(uStack_5c,uStack_60);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x17c,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_88 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_5c,uStack_60) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_5c,uStack_60));
  }
  local_98.data_._0_4_ = 0xffffffff;
  local_88 = (undefined1  [8])
             cimod::BinaryPolynomialModel<int,_double>::GetVariablesToIntegers(bpm,(int *)&local_98)
  ;
  local_70.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_68,"bpm.GetVariablesToIntegers(-1)","3",(long *)local_88,
             (int *)&local_70);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((undefined8 *)CONCAT44(uStack_5c,uStack_60) == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)CONCAT44(uStack_5c,uStack_60);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x17d,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_88 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_88 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_5c,uStack_60) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&uStack_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_5c,uStack_60));
  }
  _Var12._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38[0] = 0xffffffff;
  __l_22._M_len = 1;
  __l_22._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_22,&local_39);
  pAVar8 = (AssertHelperData *)0x0;
  local_98.data_ = (AssertHelperData *)local_68;
  for (; _Var12._M_current != pvVar1; _Var12._M_current = _Var12._M_current + 1) {
    bVar3 = __gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>::
            operator()((_Iter_equals_val<std::vector<int,std::allocator<int>>const> *)&local_98,
                       _Var12);
    pAVar8 = (AssertHelperData *)((long)&pAVar8->type + (ulong)bVar3);
  }
  local_98.data_._4_4_ = (undefined4)((ulong)local_98.data_ >> 0x20);
  local_98.data_._0_4_ = 1;
  local_70.data_ = pAVar8;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-1} )"
             ,"1",(long *)&local_70,(int *)&local_98);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x180,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_68 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var12._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38[0] = 0xfffffffe;
  __l_23._M_len = 1;
  __l_23._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_23,&local_39);
  pAVar8 = (AssertHelperData *)0x0;
  local_98.data_ = (AssertHelperData *)local_68;
  for (; _Var12._M_current != pvVar1; _Var12._M_current = _Var12._M_current + 1) {
    bVar3 = __gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>::
            operator()((_Iter_equals_val<std::vector<int,std::allocator<int>>const> *)&local_98,
                       _Var12);
    pAVar8 = (AssertHelperData *)((long)&pAVar8->type + (ulong)bVar3);
  }
  local_98.data_._4_4_ = (undefined4)((ulong)local_98.data_ >> 0x20);
  local_98.data_._0_4_ = 1;
  local_70.data_ = pAVar8;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-2} )"
             ,"1",(long *)&local_70,(int *)&local_98);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x181,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_68 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var12._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38[0] = 0xfffffffd;
  __l_24._M_len = 1;
  __l_24._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_24,&local_39);
  pAVar8 = (AssertHelperData *)0x0;
  local_98.data_ = (AssertHelperData *)local_68;
  for (; _Var12._M_current != pvVar1; _Var12._M_current = _Var12._M_current + 1) {
    bVar3 = __gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>::
            operator()((_Iter_equals_val<std::vector<int,std::allocator<int>>const> *)&local_98,
                       _Var12);
    pAVar8 = (AssertHelperData *)((long)&pAVar8->type + (ulong)bVar3);
  }
  local_98.data_._4_4_ = (undefined4)((ulong)local_98.data_ >> 0x20);
  local_98.data_._0_4_ = 1;
  local_70.data_ = pAVar8;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-3} )"
             ,"1",(long *)&local_70,(int *)&local_98);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x182,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_68 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var12._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38[0] = 0xfffffffc;
  __l_25._M_len = 1;
  __l_25._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_25,&local_39);
  pAVar8 = (AssertHelperData *)0x0;
  local_98.data_ = (AssertHelperData *)local_68;
  for (; _Var12._M_current != pvVar1; _Var12._M_current = _Var12._M_current + 1) {
    bVar3 = __gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>::
            operator()((_Iter_equals_val<std::vector<int,std::allocator<int>>const> *)&local_98,
                       _Var12);
    pAVar8 = (AssertHelperData *)((long)&pAVar8->type + (ulong)bVar3);
  }
  local_98.data_._4_4_ = (undefined4)((ulong)local_98.data_ >> 0x20);
  local_98.data_._0_4_ = 1;
  local_70.data_ = pAVar8;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4} )"
             ,"1",(long *)&local_70,(int *)&local_98);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x183,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_68 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var12._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38[0] = 0xfffffffe;
  local_38[1] = 0xffffffff;
  __l_26._M_len = 2;
  __l_26._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_26,&local_39);
  pAVar8 = (AssertHelperData *)0x0;
  local_98.data_ = (AssertHelperData *)local_68;
  for (; _Var12._M_current != pvVar1; _Var12._M_current = _Var12._M_current + 1) {
    bVar3 = __gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>::
            operator()((_Iter_equals_val<std::vector<int,std::allocator<int>>const> *)&local_98,
                       _Var12);
    pAVar8 = (AssertHelperData *)((long)&pAVar8->type + (ulong)bVar3);
  }
  local_98.data_._4_4_ = (undefined4)((ulong)local_98.data_ >> 0x20);
  local_98.data_._0_4_ = 1;
  local_70.data_ = pAVar8;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-2, -1} )"
             ,"1",(long *)&local_70,(int *)&local_98);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x184,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_68 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var12._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38[0] = 0xfffffffd;
  local_38[1] = 0xffffffff;
  __l_27._M_len = 2;
  __l_27._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_27,&local_39);
  pAVar8 = (AssertHelperData *)0x0;
  local_98.data_ = (AssertHelperData *)local_68;
  for (; _Var12._M_current != pvVar1; _Var12._M_current = _Var12._M_current + 1) {
    bVar3 = __gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>::
            operator()((_Iter_equals_val<std::vector<int,std::allocator<int>>const> *)&local_98,
                       _Var12);
    pAVar8 = (AssertHelperData *)((long)&pAVar8->type + (ulong)bVar3);
  }
  local_98.data_._4_4_ = (undefined4)((ulong)local_98.data_ >> 0x20);
  local_98.data_._0_4_ = 1;
  local_70.data_ = pAVar8;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-3, -1} )"
             ,"1",(long *)&local_70,(int *)&local_98);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x185,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_68 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var12._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38[0] = 0xfffffffc;
  local_38[1] = 0xffffffff;
  __l_28._M_len = 2;
  __l_28._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_28,&local_39);
  pAVar8 = (AssertHelperData *)0x0;
  local_98.data_ = (AssertHelperData *)local_68;
  for (; _Var12._M_current != pvVar1; _Var12._M_current = _Var12._M_current + 1) {
    bVar3 = __gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>::
            operator()((_Iter_equals_val<std::vector<int,std::allocator<int>>const> *)&local_98,
                       _Var12);
    pAVar8 = (AssertHelperData *)((long)&pAVar8->type + (ulong)bVar3);
  }
  local_98.data_._4_4_ = (undefined4)((ulong)local_98.data_ >> 0x20);
  local_98.data_._0_4_ = 1;
  local_70.data_ = pAVar8;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -1} )"
             ,"1",(long *)&local_70,(int *)&local_98);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x186,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_68 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var12._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38[0] = 0xfffffffd;
  local_38[1] = 0xfffffffe;
  __l_29._M_len = 2;
  __l_29._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_29,&local_39);
  pAVar8 = (AssertHelperData *)0x0;
  local_98.data_ = (AssertHelperData *)local_68;
  for (; _Var12._M_current != pvVar1; _Var12._M_current = _Var12._M_current + 1) {
    bVar3 = __gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>::
            operator()((_Iter_equals_val<std::vector<int,std::allocator<int>>const> *)&local_98,
                       _Var12);
    pAVar8 = (AssertHelperData *)((long)&pAVar8->type + (ulong)bVar3);
  }
  local_98.data_._4_4_ = (undefined4)((ulong)local_98.data_ >> 0x20);
  local_98.data_._0_4_ = 1;
  local_70.data_ = pAVar8;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-3, -2} )"
             ,"1",(long *)&local_70,(int *)&local_98);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x187,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_68 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var12._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38[0] = 0xfffffffc;
  local_38[1] = 0xfffffffe;
  __l_30._M_len = 2;
  __l_30._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_30,&local_39);
  pAVar8 = (AssertHelperData *)0x0;
  local_98.data_ = (AssertHelperData *)local_68;
  for (; _Var12._M_current != pvVar1; _Var12._M_current = _Var12._M_current + 1) {
    bVar3 = __gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>::
            operator()((_Iter_equals_val<std::vector<int,std::allocator<int>>const> *)&local_98,
                       _Var12);
    pAVar8 = (AssertHelperData *)((long)&pAVar8->type + (ulong)bVar3);
  }
  local_98.data_._4_4_ = (undefined4)((ulong)local_98.data_ >> 0x20);
  local_98.data_._0_4_ = 1;
  local_70.data_ = pAVar8;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -2} )"
             ,"1",(long *)&local_70,(int *)&local_98);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x188,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_68 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var12._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38[0] = 0xfffffffc;
  local_38[1] = 0xfffffffd;
  __l_31._M_len = 2;
  __l_31._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_31,&local_39);
  pAVar8 = (AssertHelperData *)0x0;
  local_98.data_ = (AssertHelperData *)local_68;
  for (; _Var12._M_current != pvVar1; _Var12._M_current = _Var12._M_current + 1) {
    bVar3 = __gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>::
            operator()((_Iter_equals_val<std::vector<int,std::allocator<int>>const> *)&local_98,
                       _Var12);
    pAVar8 = (AssertHelperData *)((long)&pAVar8->type + (ulong)bVar3);
  }
  local_98.data_._4_4_ = (undefined4)((ulong)local_98.data_ >> 0x20);
  local_98.data_._0_4_ = 1;
  local_70.data_ = pAVar8;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -3} )"
             ,"1",(long *)&local_70,(int *)&local_98);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x189,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_68 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var12._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_98.data_ = (AssertHelperData *)0xfffffffefffffffd;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(pbStack_90._4_4_,0xffffffff);
  __l_32._M_len = 3;
  __l_32._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_32,&local_39);
  lVar9 = 0;
  local_70.data_ = (AssertHelperData *)local_68;
  if (_Var12._M_current != pvVar6) {
    do {
      bVar3 = __gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>::
              operator()((_Iter_equals_val<std::vector<int,std::allocator<int>>const> *)&local_70,
                         _Var12);
      lVar9 = lVar9 + (ulong)bVar3;
      _Var12._M_current = _Var12._M_current + 1;
    } while (_Var12._M_current != pvVar6);
  }
  local_70.data_._0_4_ = 1;
  local_38 = (undefined4  [2])lVar9;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-3, -2, -1} )"
             ,"1",(long *)local_38,(int *)&local_70);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_68 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x18a,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var12._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_98.data_ = (AssertHelperData *)0xfffffffefffffffc;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(pbStack_90._4_4_,0xffffffff);
  __l_33._M_len = 3;
  __l_33._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_33,&local_39);
  local_70.data_ = (AssertHelperData *)local_68;
  if (_Var12._M_current == pvVar6) {
    lVar9 = 0;
  }
  else {
    lVar9 = 0;
    do {
      bVar3 = __gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>::
              operator()((_Iter_equals_val<std::vector<int,std::allocator<int>>const> *)&local_70,
                         _Var12);
      lVar9 = lVar9 + (ulong)bVar3;
      _Var12._M_current = _Var12._M_current + 1;
    } while (_Var12._M_current != pvVar6);
  }
  local_70.data_._0_4_ = 1;
  local_38 = (undefined4  [2])lVar9;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -2, -1} )"
             ,"1",(long *)local_38,(int *)&local_70);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x18b,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_68 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var12._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_98.data_ = (AssertHelperData *)0xfffffffdfffffffc;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(pbStack_90._4_4_,0xffffffff);
  __l_34._M_len = 3;
  __l_34._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_34,&local_39);
  lVar9 = 0;
  local_70.data_ = (AssertHelperData *)local_68;
  if (_Var12._M_current != pvVar6) {
    do {
      bVar3 = __gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>::
              operator()((_Iter_equals_val<std::vector<int,std::allocator<int>>const> *)&local_70,
                         _Var12);
      lVar9 = lVar9 + (ulong)bVar3;
      _Var12._M_current = _Var12._M_current + 1;
    } while (_Var12._M_current != pvVar6);
  }
  local_70.data_._0_4_ = 1;
  local_38 = (undefined4  [2])lVar9;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -3, -1} )"
             ,"1",(long *)local_38,(int *)&local_70);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_68 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x18c,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var12._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_98.data_ = (AssertHelperData *)0xfffffffdfffffffc;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(pbStack_90._4_4_,0xfffffffe);
  __l_35._M_len = 3;
  __l_35._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_35,&local_39);
  lVar9 = 0;
  local_70.data_ = (AssertHelperData *)local_68;
  if (_Var12._M_current != pvVar6) {
    do {
      bVar3 = __gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>::
              operator()((_Iter_equals_val<std::vector<int,std::allocator<int>>const> *)&local_70,
                         _Var12);
      lVar9 = lVar9 + (ulong)bVar3;
      _Var12._M_current = _Var12._M_current + 1;
    } while (_Var12._M_current != pvVar6);
  }
  local_70.data_._0_4_ = 1;
  local_38 = (undefined4  [2])lVar9;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -3, -2} )"
             ,"1",(long *)local_38,(int *)&local_70);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x18d,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_68 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  _Var12._M_current =
       (bpm->poly_key_list_).
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = (bpm->poly_key_list_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_98.data_ = (AssertHelperData *)0xfffffffdfffffffc;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0xfffffffffffffffe;
  __l_36._M_len = 4;
  __l_36._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l_36,&local_39);
  lVar9 = 0;
  local_70.data_ = (AssertHelperData *)local_68;
  if (_Var12._M_current != pvVar6) {
    do {
      bVar3 = __gnu_cxx::__ops::_Iter_equals_val<std::vector<int,std::allocator<int>>const>::
              operator()((_Iter_equals_val<std::vector<int,std::allocator<int>>const> *)&local_70,
                         _Var12);
      lVar9 = lVar9 + (ulong)bVar3;
      _Var12._M_current = _Var12._M_current + 1;
    } while (_Var12._M_current != pvVar6);
  }
  local_70.data_._0_4_ = 1;
  local_38 = (undefined4  [2])lVar9;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_88,
             "std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -3, -2, -1})"
             ,"1",(long *)local_38,(int *)&local_70);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_68 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x18e,pcVar11);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_68 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_68 + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  pdVar4 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_00121365:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(1.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x191,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar7 = 0;
    do {
      iVar7 = iVar7 + (uint)(ABS(*pdVar4 + -1.0) < 1e-15);
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != pdVar2);
    local_88[0] = (internal)(iVar7 != 0);
    if (!(bool)local_88[0]) goto LAB_00121365;
  }
  pdVar4 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_00121480:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(2.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x192,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar7 = 0;
    do {
      iVar7 = iVar7 + (uint)(ABS(*pdVar4 + -2.0) < 1e-15);
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != pdVar2);
    local_88[0] = (internal)(iVar7 != 0);
    if (!(bool)local_88[0]) goto LAB_00121480;
  }
  pdVar4 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_0012159b:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(3.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x193,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar7 = 0;
    do {
      iVar7 = iVar7 + (uint)(ABS(*pdVar4 + -3.0) < 1e-15);
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != pdVar2);
    local_88[0] = (internal)(iVar7 != 0);
    if (!(bool)local_88[0]) goto LAB_0012159b;
  }
  pdVar4 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_001216b6:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(4.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x194,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar7 = 0;
    do {
      iVar7 = iVar7 + (uint)(ABS(*pdVar4 + -4.0) < 1e-15);
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != pdVar2);
    local_88[0] = (internal)(iVar7 != 0);
    if (!(bool)local_88[0]) goto LAB_001216b6;
  }
  pdVar4 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_001217d1:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(12.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x195,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar7 = 0;
    do {
      iVar7 = iVar7 + (uint)(ABS(*pdVar4 + -12.0) < 1e-15);
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != pdVar2);
    local_88[0] = (internal)(iVar7 != 0);
    if (!(bool)local_88[0]) goto LAB_001217d1;
  }
  pdVar4 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_001218ec:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(13.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x196,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar7 = 0;
    do {
      iVar7 = iVar7 + (uint)(ABS(*pdVar4 + -13.0) < 1e-15);
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != pdVar2);
    local_88[0] = (internal)(iVar7 != 0);
    if (!(bool)local_88[0]) goto LAB_001218ec;
  }
  pdVar4 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_00121a07:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(14.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x197,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar7 = 0;
    do {
      iVar7 = iVar7 + (uint)(ABS(*pdVar4 + -14.0) < 1e-15);
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != pdVar2);
    local_88[0] = (internal)(iVar7 != 0);
    if (!(bool)local_88[0]) goto LAB_00121a07;
  }
  pdVar4 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_00121b22:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(23.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x198,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar7 = 0;
    do {
      iVar7 = iVar7 + (uint)(ABS(*pdVar4 + -23.0) < 1e-15);
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != pdVar2);
    local_88[0] = (internal)(iVar7 != 0);
    if (!(bool)local_88[0]) goto LAB_00121b22;
  }
  pdVar4 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_00121c3d:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(24.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x199,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar7 = 0;
    do {
      iVar7 = iVar7 + (uint)(ABS(*pdVar4 + -24.0) < 1e-15);
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != pdVar2);
    local_88[0] = (internal)(iVar7 != 0);
    if (!(bool)local_88[0]) goto LAB_00121c3d;
  }
  pdVar4 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_00121d58:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(34.0 , bpm.GetValueList())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x19a,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar7 = 0;
    do {
      iVar7 = iVar7 + (uint)(ABS(*pdVar4 + -34.0) < 1e-15);
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != pdVar2);
    local_88[0] = (internal)(iVar7 != 0);
    if (!(bool)local_88[0]) goto LAB_00121d58;
  }
  pdVar4 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_00121e73:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(123.0 , bpm.GetValueList())","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x19b,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar7 = 0;
    do {
      iVar7 = iVar7 + (uint)(ABS(*pdVar4 + -123.0) < 1e-15);
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != pdVar2);
    local_88[0] = (internal)(iVar7 != 0);
    if (!(bool)local_88[0]) goto LAB_00121e73;
  }
  pdVar4 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_00121f8e:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(124.0 , bpm.GetValueList())","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x19c,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar7 = 0;
    do {
      iVar7 = iVar7 + (uint)(ABS(*pdVar4 + -124.0) < 1e-15);
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != pdVar2);
    local_88[0] = (internal)(iVar7 != 0);
    if (!(bool)local_88[0]) goto LAB_00121f8e;
  }
  pdVar4 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_001220a9:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(134.0 , bpm.GetValueList())","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x19d,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar7 = 0;
    do {
      iVar7 = iVar7 + (uint)(ABS(*pdVar4 + -134.0) < 1e-15);
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != pdVar2);
    local_88[0] = (internal)(iVar7 != 0);
    if (!(bool)local_88[0]) goto LAB_001220a9;
  }
  pdVar4 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 == pdVar2) {
    local_88[0] = (internal)0x0;
LAB_001221c4:
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_88,
               (AssertionResult *)"EXPECT_CONTAIN(234.0 , bpm.GetValueList())","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x19e,(char *)local_68);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68 != (undefined1  [8])&aStack_58) {
      operator_delete((void *)local_68,
                      CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                               aStack_58._M_allocated_capacity._0_4_) + 1);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    iVar7 = 0;
    do {
      iVar7 = iVar7 + (uint)(ABS(*pdVar4 + -234.0) < 1e-15);
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != pdVar2);
    local_88[0] = (internal)(iVar7 != 0);
    if (!(bool)local_88[0]) goto LAB_001221c4;
  }
  pdVar4 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (bpm->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 == pdVar2) {
    local_88 = (undefined1  [8])((ulong)(uint7)local_88._1_7_ << 8);
  }
  else {
    iVar7 = 0;
    do {
      iVar7 = iVar7 + (uint)(ABS(*pdVar4 + -1234.0) < 1e-15);
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != pdVar2);
    local_88[0] = (internal)(iVar7 != 0);
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar7 != 0) goto LAB_0012237e;
  }
  pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::Message::Message((Message *)&local_98);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_68,(internal *)local_88,
             (AssertionResult *)"EXPECT_CONTAIN(1234.0, bpm.GetValueList())","false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_70,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
             0x19f,(char *)local_68);
  testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  if (local_68 != (undefined1  [8])&aStack_58) {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) + 1);
  }
  if (local_98.data_ != (AssertHelperData *)0x0) {
    (**(code **)(*(long *)local_98.data_ + 8))();
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
LAB_0012237e:
  cimod::BinaryPolynomialModel<int,_double>::GetSortedVariables
            ((vector<int,_std::allocator<int>_> *)local_68,bpm);
  local_98.data_._0_4_ = 0xfffffffc;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_88,"sorted_variables[0]","-4",(int *)local_68,(int *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x1a3,pcVar11);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_._0_4_ = 0xfffffffd;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_88,"sorted_variables[1]","-3",(int *)((long)local_68 + 4),
             (int *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x1a4,pcVar11);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_._0_4_ = 0xfffffffe;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_88,"sorted_variables[2]","-2",(int *)((long)local_68 + 8),
             (int *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x1a5,pcVar11);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_98.data_._0_4_ = 0xffffffff;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_88,"sorted_variables[3]","-1",(int *)((long)local_68 + 0xc),
             (int *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x1a6,pcVar11);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_70.data_._0_4_ = 0xffffffff;
  cVar5 = std::
          _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)bpm,(key_type_conflict *)&local_70);
  local_98.data_ =
       (AssertHelperData *)
       (ulong)(cVar5.super__Node_iterator_base<int,_false>._M_cur != (__node_type *)0x0);
  local_38[0] = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_88,"bpm.GetVariables().count(-1)","1",(unsigned_long *)&local_98,
             local_38);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x1a9,pcVar11);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_70.data_._0_4_ = 0xfffffffe;
  cVar5 = std::
          _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)bpm,(key_type_conflict *)&local_70);
  local_98.data_ =
       (AssertHelperData *)
       (ulong)(cVar5.super__Node_iterator_base<int,_false>._M_cur != (__node_type *)0x0);
  local_38[0] = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_88,"bpm.GetVariables().count(-2)","1",(unsigned_long *)&local_98,
             local_38);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x1aa,pcVar11);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_70.data_._0_4_ = 0xfffffffd;
  cVar5 = std::
          _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)bpm,(key_type_conflict *)&local_70);
  local_98.data_ =
       (AssertHelperData *)
       (ulong)(cVar5.super__Node_iterator_base<int,_false>._M_cur != (__node_type *)0x0);
  local_38[0] = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_88,"bpm.GetVariables().count(-3)","1",(unsigned_long *)&local_98,
             local_38);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x1ab,pcVar11);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  local_70.data_._0_4_ = 0xfffffffc;
  cVar5 = std::
          _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)bpm,(key_type_conflict *)&local_70);
  local_98.data_ =
       (AssertHelperData *)
       (ulong)(cVar5.super__Node_iterator_base<int,_false>._M_cur != (__node_type *)0x0);
  local_38[0] = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_88,"bpm.GetVariables().count(-4)","1",(unsigned_long *)&local_98,
             local_38);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (pbStack_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (pbStack_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x1ac,pcVar11);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_98.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data_ + 8))();
    }
  }
  if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_80,pbStack_80);
  }
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_68 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete((void *)local_68,
                    CONCAT44(aStack_58._M_allocated_capacity._4_4_,
                             aStack_58._M_allocated_capacity._0_4_) - (long)local_68);
  }
  return;
}

Assistant:

void StateTestBPMINT(const BinaryPolynomialModel<int32_t, double> &bpm) {
   
   EXPECT_EQ(bpm.GetNumVariables(), 4);

   EXPECT_DOUBLE_EQ(bpm.GetOffset(), 0.0);
   
   EXPECT_EQ(bpm.GetNumInteractions(), 15);
   
   EXPECT_EQ(bpm.GetDegree(), 4);
      
   //Polynomial
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-1}            ), 1.0   );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-2}            ), 2.0   );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-3}            ), 3.0   );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-4}            ), 4.0   );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-2, -1}        ), 12.0  );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-3, -1}        ), 13.0  );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-4, -1}        ), 14.0  );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-3, -2}        ), 23.0  );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-4, -2}        ), 24.0  );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-4, -3}        ), 34.0  );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-3, -2, -1}    ), 123.0 );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-4, -2, -1}    ), 124.0 );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-4, -3, -1}    ), 134.0 );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-4, -3, -2}    ), 234.0 );
   EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-4, -3, -2, -1}), 1234.0);
   
   //Polynomial duplicate key
   if (bpm.GetVartype() == cimod::Vartype::SPIN) {
      EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-1, -1, -1}            ), 1.0 );
      EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-1, -1, -1, -2}        ), 12.0);
      EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-1, -3, -3, -3}        ), 13.0);
      EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-3, -2, -3, -2, -3, -2}), 23.0);
   }
   else if (bpm.GetVartype() == cimod::Vartype::BINARY) {
      EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-1, -1, -1, -1}            ), 1.0 );
      EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-1, -1, -1, -2, -2}        ), 12.0);
      EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-1, -3, -3, -3, -1}        ), 13.0);
      EXPECT_DOUBLE_EQ(bpm.GetPolynomial({-3, -2, -3, -2, -3, -2, -2}), 23.0);
   }
   
   //variables_to_integers
   EXPECT_EQ(bpm.GetVariablesToIntegers(-4), 0);
   EXPECT_EQ(bpm.GetVariablesToIntegers(-3), 1);
   EXPECT_EQ(bpm.GetVariablesToIntegers(-2), 2);
   EXPECT_EQ(bpm.GetVariablesToIntegers(-1), 3);
   
   //Polynomial Key
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-1}            ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-2}            ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-3}            ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4}            ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-2, -1}        ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-3, -1}        ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -1}        ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-3, -2}        ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -2}        ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -3}        ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-3, -2, -1}    ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -2, -1}    ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -3, -1}    ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -3, -2}    ), 1);
   EXPECT_EQ(std::count(bpm.GetKeyList().begin(), bpm.GetKeyList().end(), std::vector<int32_t>{-4, -3, -2, -1}), 1);

   //Polynomial Val
   EXPECT_TRUE(EXPECT_CONTAIN(1.0   , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(2.0   , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(3.0   , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(4.0   , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(12.0  , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(13.0  , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(14.0  , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(23.0  , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(24.0  , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(34.0  , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(123.0 , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(124.0 , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(134.0 , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(234.0 , bpm.GetValueList()));
   EXPECT_TRUE(EXPECT_CONTAIN(1234.0, bpm.GetValueList()));

   //sorted_variables
   auto sorted_variables = bpm.GetSortedVariables();
   EXPECT_EQ(sorted_variables[0], -4);
   EXPECT_EQ(sorted_variables[1], -3);
   EXPECT_EQ(sorted_variables[2], -2);
   EXPECT_EQ(sorted_variables[3], -1);
   
   //variables
   EXPECT_EQ(bpm.GetVariables().count(-1), 1);
   EXPECT_EQ(bpm.GetVariables().count(-2), 1);
   EXPECT_EQ(bpm.GetVariables().count(-3), 1);
   EXPECT_EQ(bpm.GetVariables().count(-4), 1);
}